

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall ObjectFileDB::process_link_data(ObjectFileDB *this)

{
  pointer pbVar1;
  pointer pOVar2;
  double dVar3;
  mapped_type *pmVar4;
  ObjectFileData *obj;
  pointer data;
  iterator __begin2;
  pointer __k;
  Stats combined_stats;
  Timer process_link_timer;
  LinkedObjectFile local_108;
  
  puts("- Processing Link Data...");
  Timer::Timer(&process_link_timer);
  combined_stats.data_bytes = 0;
  combined_stats.code_bytes = 0;
  combined_stats.function_count = 0;
  combined_stats.decoded_ops = 0;
  combined_stats.v3_link_bytes = 0;
  combined_stats.v3_symbol_count = 0;
  combined_stats.v3_symbol_link_offset = 0;
  combined_stats.v3_symbol_link_word = 0;
  combined_stats.v3_pointers = 0;
  combined_stats.v3_split_pointers = 0;
  combined_stats.v3_word_pointers = 0;
  combined_stats.v3_pointer_seeks = 0;
  combined_stats.total_v2_link_bytes = 0;
  combined_stats.total_v2_symbol_links = 0;
  combined_stats.total_v2_symbol_count = 0;
  combined_stats.v3_code_bytes = 0;
  combined_stats.n_fp_reg_use = 0;
  combined_stats.n_fp_reg_use_resolved = 0;
  combined_stats.total_code_bytes = 0;
  combined_stats.total_v2_code_bytes = 0;
  combined_stats.total_v2_pointers = 0;
  combined_stats.total_v2_pointer_seeks = 0;
  pbVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pbVar1 - (long)__k >> 5) {
    for (; __k != pbVar1; __k = __k + 1) {
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)this,__k);
      pOVar2 = (pmVar4->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (data = (pmVar4->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                  _M_impl.super__Vector_impl_data._M_start; data != pOVar2; data = data + 1) {
        to_linked_object_file(&local_108,&data->data,&(data->record).name);
        LinkedObjectFile::operator=(&data->linked_data,&local_108);
        LinkedObjectFile::~LinkedObjectFile(&local_108);
        LinkedObjectFile::Stats::add(&combined_stats,&(data->linked_data).stats);
      }
    }
    puts("Processed Link Data:");
    printf(" code %d bytes\n",combined_stats._0_8_ & 0xffffffff);
    printf(" v2 code %d bytes\n",(ulong)combined_stats._0_8_ >> 0x20);
    printf(" v2 link data %d bytes\n",combined_stats._16_8_ & 0xffffffff);
    printf(" v2 pointers %d\n",combined_stats._8_8_ & 0xffffffff);
    printf(" v2 pointer seeks %d\n",(ulong)combined_stats._8_8_ >> 0x20);
    printf(" v2 symbols %d\n",combined_stats._24_8_ & 0xffffffff);
    printf(" v2 symbol links %d\n",(ulong)combined_stats._16_8_ >> 0x20);
    printf(" v3 code %d bytes\n",(ulong)combined_stats._24_8_ >> 0x20);
    printf(" v3 link data %d bytes\n",combined_stats._48_8_ & 0xffffffff);
    printf(" v3 pointers %d\n",combined_stats._32_8_ & 0xffffffff);
    printf("   split %d\n",(ulong)combined_stats._32_8_ >> 0x20);
    printf("   word  %d\n",combined_stats._40_8_ & 0xffffffff);
    printf(" v3 pointer seeks %d\n",(ulong)combined_stats._40_8_ >> 0x20);
    printf(" v3 symbols %d\n",(ulong)combined_stats._48_8_ >> 0x20);
    printf(" v3 offset symbol links %d\n",combined_stats._56_8_ & 0xffffffff);
    printf(" v3 word symbol links %d\n",(ulong)combined_stats._56_8_ >> 0x20);
    dVar3 = Timer::getMs(&process_link_timer);
    printf(" total %.3f ms\n",SUB84(dVar3,0));
    putchar(10);
    return;
  }
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,
                "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:222:16)]"
               );
}

Assistant:

void ObjectFileDB::process_link_data() {
  printf("- Processing Link Data...\n");
  Timer process_link_timer;

  LinkedObjectFile::Stats combined_stats;

  for_each_obj([&](ObjectFileData& obj) {
    obj.linked_data = to_linked_object_file(obj.data, obj.record.name);
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Processed Link Data:\n");
  printf(" code %d bytes\n", combined_stats.total_code_bytes);
  printf(" v2 code %d bytes\n", combined_stats.total_v2_code_bytes);
  printf(" v2 link data %d bytes\n", combined_stats.total_v2_link_bytes);
  printf(" v2 pointers %d\n", combined_stats.total_v2_pointers);
  printf(" v2 pointer seeks %d\n", combined_stats.total_v2_pointer_seeks);
  printf(" v2 symbols %d\n", combined_stats.total_v2_symbol_count);
  printf(" v2 symbol links %d\n", combined_stats.total_v2_symbol_links);

  printf(" v3 code %d bytes\n", combined_stats.v3_code_bytes);
  printf(" v3 link data %d bytes\n", combined_stats.v3_link_bytes);
  printf(" v3 pointers %d\n", combined_stats.v3_pointers);
  printf("   split %d\n", combined_stats.v3_split_pointers);
  printf("   word  %d\n", combined_stats.v3_word_pointers);
  printf(" v3 pointer seeks %d\n", combined_stats.v3_pointer_seeks);
  printf(" v3 symbols %d\n", combined_stats.v3_symbol_count);
  printf(" v3 offset symbol links %d\n", combined_stats.v3_symbol_link_offset);
  printf(" v3 word symbol links %d\n", combined_stats.v3_symbol_link_word);

  printf(" total %.3f ms\n", process_link_timer.getMs());
  printf("\n");
}